

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O2

Var Js::ProfilingHelpers::ProfiledNewScObjArraySpread_Jit
              (AuxArray<unsigned_int> *spreadIndices,Var callee,void *framePointer,
              ProfileId profileId,ProfileId arrayProfileId,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  long lVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  JavascriptCallStackLayout *pJVar7;
  CallInfo caller;
  Var pvVar8;
  void **__s;
  Arguments *args_00;
  uint uVar9;
  int in_stack_00000030;
  void *apvStack_100 [2];
  Var stackArgs [8];
  Arguments local_b0;
  Arguments local_a0;
  Arguments local_90;
  Arguments local_80;
  Arguments local_70;
  CallInfo local_60;
  CallInfo callInfo_local;
  undefined1 auStack_50 [8];
  ArgumentReader args;
  
  __s = apvStack_100 + 1;
  local_60 = callInfo;
  if (callInfo._0_4_ != in_stack_00000030) {
    AssertCount = AssertCount + 1;
    apvStack_100[0] = (void *)0x9dae91;
    Throw::LogAssert();
    apvStack_100[0] = (void *)0x9daea1;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    apvStack_100[0] = (void *)0x9daec9;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x226,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_009db087;
    *puVar6 = 0;
  }
  apvStack_100[0] = (void *)0x9daee6;
  ArgumentReader::ArgumentReader((ArgumentReader *)auStack_50,&local_60,(Var *)&stack0x00000038);
  apvStack_100[0] = (void *)0x9daeee;
  pJVar7 = JavascriptCallStackLayout::FromFramePointer(framePointer);
  apvStack_100[0] = (void *)0x9daef6;
  caller = (CallInfo)
           UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)pJVar7);
  auVar3 = auStack_50;
  if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
    args_00 = &local_80;
    local_80.Info = (Type)auStack_50;
    local_80.Values = (Type)args.super_Arguments.Info;
  }
  else {
    scriptContext =
         (((((Type *)((long)caller + 8))->ptr->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
         .scriptContext.ptr;
    local_b0.Info = (Type)auStack_50;
    local_b0.Values = (Type)args.super_Arguments.Info;
    apvStack_100[0] = (void *)0x9daf3b;
    callInfo_local = caller;
    args.super_Arguments.Values = (Type)callee;
    uVar5 = JavascriptFunction::GetSpreadSize(&local_b0,spreadIndices,scriptContext);
    if (0xffffff < uVar5) {
      AssertCount = AssertCount + 1;
      apvStack_100[0] = (void *)0x9daf53;
      Throw::LogAssert();
      apvStack_100[0] = (void *)0x9daf63;
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      apvStack_100[0] = (void *)0x9daf8b;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                  ,0x232,"(spreadSize == (((1 << 24) - 1) & spreadSize))",
                                  "spreadSize == (((1 << 24) - 1) & spreadSize)");
      if (!bVar4) {
LAB_009db087:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    uVar9 = uVar5 & 0xffffff;
    local_70.Info._4_4_ = 0;
    local_70.Info._0_4_ = auVar3._0_4_ & 0xff000000 | uVar9;
    if (uVar9 < 9) {
      __s = apvStack_100 + 1;
      stackArgs[5] = (Var)0x0;
      stackArgs[6] = (Var)0x0;
      stackArgs[3] = (Var)0x0;
      stackArgs[4] = (Var)0x0;
      stackArgs[1] = (Var)0x0;
      stackArgs[2] = (Var)0x0;
      apvStack_100[1] = (void *)0x0;
      stackArgs[0] = (Var)0x0;
    }
    else {
      apvStack_100[0] = (void *)0x9dafd2;
      ThreadContext::ProbeStack
                (scriptContext->threadContext,(ulong)(uVar9 * 8) + 0xc00,scriptContext,(PVOID)0x0);
      lVar2 = -(ulong)(uVar9 * 8 + 0xf & 0xfffffff0);
      __s = (void **)((long)stackArgs + lVar2 + -8);
      *(undefined8 *)((long)apvStack_100 + lVar2) = 0x9daff3;
      memset(__s,0,(ulong)(uVar9 * 8));
    }
    callee = args.super_Arguments.Values;
    local_a0.Info = (Type)auStack_50;
    local_a0.Values = (Type)args.super_Arguments.Info;
    local_70.Values = __s;
    __s[-1] = (void *)0x9db055;
    JavascriptFunction::SpreadArgs(&local_a0,&local_70,spreadIndices,scriptContext);
    args_00 = &local_90;
    local_90.Info = local_70.Info;
    local_90.Values = local_70.Values;
    caller = callInfo_local;
  }
  __s[-1] = (void *)0x9db078;
  pvVar8 = ProfiledNewScObjArray(callee,args_00,(ScriptFunction *)caller,profileId,arrayProfileId);
  return pvVar8;
}

Assistant:

Var ProfilingHelpers::ProfiledNewScObjArraySpread_Jit(
        const Js::AuxArray<uint32> *spreadIndices,
        const Var callee,
        void *const framePointer,
        const ProfileId profileId,
        const ProfileId arrayProfileId,
        CallInfo callInfo,
        ...)
    {
        ARGUMENTS(args, spreadIndices, callee, framePointer, profileId, arrayProfileId, callInfo);

        Js::ScriptFunction *function = UnsafeVarTo<ScriptFunction>(JavascriptCallStackLayout::FromFramePointer(framePointer)->functionObject);
        ScriptContext* scriptContext = function->GetScriptContext();

        JIT_HELPER_REENTRANT_HEADER(ProfiledNewScObjArraySpread);
        // GetSpreadSize ensures that spreadSize < 2^24
        uint32 spreadSize = 0;
        if (spreadIndices != nullptr)
        {
            Arguments outArgs(CallInfo(args.Info.Flags, 0), nullptr);
            spreadSize = JavascriptFunction::GetSpreadSize(args, spreadIndices, scriptContext);
            Assert(spreadSize == (((1 << 24) - 1) & spreadSize));
            // Allocate room on the stack for the spread args.
            outArgs.Info.Count = spreadSize;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            size_t outArgsSize = 0;
            if (outArgs.Info.Count > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, outArgs.Info.Count * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                outArgsSize = outArgs.Info.Count * sizeof(Var);
                outArgs.Values = (Var*)_alloca(outArgsSize);
                ZeroMemory(outArgs.Values, outArgsSize);
            }
            else
            {
                outArgs.Values = stackArgs;
                outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
                ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
            }
            JavascriptFunction::SpreadArgs(args, outArgs, spreadIndices, scriptContext);
            return
                ProfiledNewScObjArray(
                    callee,
                    outArgs,
                    function,
                    profileId,
                    arrayProfileId);
        }
        else
        {
            return
                ProfiledNewScObjArray(
                    callee,
                    args,
                    function,
                    profileId,
                    arrayProfileId);
        }
        JIT_HELPER_END(ProfiledNewScObjArraySpread);
    }